

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmState *pcVar3;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  string currentStart;
  string message;
  string srcList;
  ostringstream err;
  string local_200;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_1c0);
  bVar5 = cmsys::SystemTools::FileExists(&local_1c0);
  if (bVar5) {
    pcVar3 = this->State;
    pcVar2 = local_1a0 + 0x10;
    local_1a0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_HOME_DIRECTORY","");
    psVar6 = cmState::GetInitializedCacheValue(pcVar3,(string *)local_1a0);
    if ((pointer)local_1a0._0_8_ != pcVar2) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (psVar6 == (string *)0x0) {
      iVar9 = 0;
    }
    else {
      pcVar3 = this->State;
      paVar1 = &local_200.field_2;
      local_200._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,"CMAKE_HOME_DIRECTORY","");
      psVar6 = cmState::GetInitializedCacheValue(pcVar3,&local_200);
      pcVar4 = (psVar6->_M_dataplus)._M_p;
      local_1a0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,pcVar4,pcVar4 + psVar6->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append(local_1a0);
      psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
      pcVar4 = (psVar6->_M_dataplus)._M_p;
      local_200._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,pcVar4,pcVar4 + psVar6->_M_string_length);
      std::__cxx11::string::append((char *)&local_200);
      bVar5 = cmsys::SystemTools::SameFile((string *)local_1a0,&local_200);
      if (!bVar5) {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"The source \"","");
        std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_200._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_1e0);
        std::__cxx11::string::_M_append((char *)&local_1e0,local_1a0._0_8_);
        std::__cxx11::string::append((char *)&local_1e0);
        std::__cxx11::string::append((char *)&local_1e0);
        cmSystemTools::Error(&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != paVar1) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1a0._0_8_ != pcVar2) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      iVar9 = (uint)bVar5 + (uint)bVar5 * 2 + -2;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
    bVar5 = cmsys::SystemTools::FileIsDirectory(psVar6);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"The source directory \"",0x16);
      psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      lVar8 = 0x2d;
      pcVar10 = "\" does not appear to contain CMakeLists.txt.\n";
    }
    else {
      psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
      bVar5 = cmsys::SystemTools::FileExists(psVar6);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"The source directory \"",0x16);
        psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        lVar8 = 0x1e;
        pcVar10 = "\" is a file, not a directory.\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"The source directory \"",0x16);
        psVar6 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        lVar8 = 0x12;
        pcVar10 = "\" does not exist.\n";
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "Specify --help for usage, or press the help button on the CMake GUI.",0x44);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    iVar9 = -2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  return iVar9;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      *this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}